

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_write_chunk(p_ply ply,void *anybuffer,size_t size)

{
  size_t sVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  char *buffer;
  ulong local_30;
  
  local_30 = 0;
  do {
    while( true ) {
      if (in_RDX <= local_30) {
        return 1;
      }
      if (0x1fff < *(ulong *)(in_RDI + 0x2058)) break;
      *(undefined1 *)(in_RDI + 0x48 + *(long *)(in_RDI + 0x2058)) =
           *(undefined1 *)(in_RSI + local_30);
      *(long *)(in_RDI + 0x2058) = *(long *)(in_RDI + 0x2058) + 1;
      local_30 = local_30 + 1;
    }
    *(undefined8 *)(in_RDI + 0x2058) = 0;
    sVar1 = fwrite((void *)(in_RDI + 0x48),1,0x2000,*(FILE **)(in_RDI + 0x38));
  } while (0x1fff < sVar1);
  return 0;
}

Assistant:

static int ply_write_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->buffer_last <= BUFFERSIZE);
    while (i < size) {
        if (ply->buffer_last < BUFFERSIZE) {
            ply->buffer[ply->buffer_last] = buffer[i];
            ply->buffer_last++;
            i++;
        } else {
            ply->buffer_last = 0;
            if (fwrite(ply->buffer, 1, BUFFERSIZE, ply->fp) < BUFFERSIZE)
                return 0;
        }
    }
    return 1;
}